

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_exception_translator_registry.hpp
# Opt level: O3

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this,const_iterator it)

{
  if ((this->m_translators).
      super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == it._M_current) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Unknown exception","");
  }
  else {
    (*(*it._M_current)->_vptr_IExceptionTranslator[2])(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string tryTranslators( std::vector<const IExceptionTranslator*>::const_iterator it ) const {
            if( it == m_translators.end() )
                return "Unknown exception";

            try {
                return (*it)->translate();
            }
            catch(...) {
                return tryTranslators( it+1 );
            }
        }